

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O0

void usage(_Bool standalone)

{
  FILE *local_18;
  _Bool standalone_local;
  
  if (standalone) {
    local_18 = _stderr;
  }
  else {
    local_18 = _stdout;
  }
  fprintf(local_18,
          "Usage: puttygen ( keyfile | -t type [ -b bits ] )\n                [ -C comment ] [ -P ] [ -q ]\n                [ -o output-keyfile ] [ -O type | -l | -L | -p ]\n"
         );
  if (standalone) {
    fprintf(_stderr,"Use \"puttygen --help\" for more detail.\n");
  }
  return;
}

Assistant:

void usage(bool standalone)
{
    fprintf(standalone ? stderr : stdout,
            "Usage: puttygen ( keyfile | -t type [ -b bits ] )\n"
            "                [ -C comment ] [ -P ] [ -q ]\n"
            "                [ -o output-keyfile ] [ -O type | -l | -L"
            " | -p ]\n");
    if (standalone)
        fprintf(stderr,
                "Use \"puttygen --help\" for more detail.\n");
}